

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O3

Vec_Ptr_t * Abc_NodeFindCut(Abc_ManCut_t *p,Abc_Obj_t *pRoot,int fContain)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x105,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  if ((*(uint *)&pRoot->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x106,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  pVVar6 = p->vVisited;
  pVVar6->nSize = 0;
  iVar4 = 0;
  ppvVar5 = pVVar6->pArray;
  if (pVVar6->nCap == 0) {
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x80);
      iVar4 = 0;
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,0x80);
      iVar4 = pVVar6->nSize;
    }
    pVVar6->pArray = ppvVar5;
    pVVar6->nCap = 0x10;
  }
  pVVar6->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pRoot;
  pVVar6 = p->vVisited;
  pvVar3 = pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray];
  uVar2 = pVVar6->nSize;
  if (uVar2 == pVVar6->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = 0x10;
    }
    else {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar5 = pVVar6->pArray;
  }
  iVar4 = pVVar6->nSize;
  pVVar6->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pvVar3;
  pVVar6 = p->vVisited;
  pvVar3 = pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]];
  uVar2 = pVVar6->nSize;
  if (uVar2 == pVVar6->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = 0x10;
    }
    else {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar5 = pVVar6->pArray;
  }
  iVar4 = pVVar6->nSize;
  pVVar6->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pvVar3;
  pRoot->field_0x14 = pRoot->field_0x14 | 0x20;
  puVar1 = (uint *)((long)pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray] + 0x14);
  *puVar1 = *puVar1 | 0x20;
  puVar1 = (uint *)((long)pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]] + 0x14);
  *puVar1 = *puVar1 | 0x20;
  pVVar6 = p->vNodeLeaves;
  pVVar6->nSize = 0;
  pvVar3 = pRoot->pNtk->vObjs->pArray[*(pRoot->vFanins).pArray];
  iVar4 = 0;
  ppvVar5 = pVVar6->pArray;
  if (pVVar6->nCap == 0) {
    if (ppvVar5 == (void **)0x0) {
      ppvVar5 = (void **)malloc(0x80);
      iVar4 = 0;
    }
    else {
      ppvVar5 = (void **)realloc(ppvVar5,0x80);
      iVar4 = pVVar6->nSize;
    }
    pVVar6->pArray = ppvVar5;
    pVVar6->nCap = 0x10;
  }
  pVVar6->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pvVar3;
  pVVar6 = p->vNodeLeaves;
  pvVar3 = pRoot->pNtk->vObjs->pArray[(pRoot->vFanins).pArray[1]];
  uVar2 = pVVar6->nSize;
  if (uVar2 == pVVar6->nCap) {
    if ((int)uVar2 < 0x10) {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = 0x10;
    }
    else {
      if (pVVar6->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
      }
      pVVar6->pArray = ppvVar5;
      pVVar6->nCap = uVar2 * 2;
    }
  }
  else {
    ppvVar5 = pVVar6->pArray;
  }
  iVar4 = pVVar6->nSize;
  pVVar6->nSize = iVar4 + 1;
  ppvVar5[iVar4] = pvVar3;
  do {
    iVar4 = Abc_NodeBuildCutLevelOne_int(p->vVisited,p->vNodeLeaves,p->nNodeSizeMax,p->nNodeFanStop)
    ;
  } while (iVar4 != 0);
  pVVar6 = p->vNodeLeaves;
  if (p->nNodeSizeMax < pVVar6->nSize) {
    __assert_fail("Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                  ,0x118,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
  }
  if (fContain == 0) {
    pVVar6 = p->vVisited;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar7] + 0x14);
        *puVar1 = *puVar1 & 0xffffffdf;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
  }
  else {
    if (p->nConeSizeMax <= p->nNodeSizeMax) {
      __assert_fail("p->nNodeSizeMax < p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,0x124,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
    p->vConeLeaves->nSize = 0;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        pvVar3 = pVVar6->pArray[lVar7];
        pVVar6 = p->vConeLeaves;
        uVar2 = pVVar6->nSize;
        if (uVar2 == pVVar6->nCap) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,0x80);
            }
            pVVar6->pArray = ppvVar5;
            pVVar6->nCap = 0x10;
          }
          else {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
            pVVar6->pArray = ppvVar5;
            pVVar6->nCap = uVar2 * 2;
          }
        }
        else {
          ppvVar5 = pVVar6->pArray;
        }
        iVar4 = pVVar6->nSize;
        pVVar6->nSize = iVar4 + 1;
        ppvVar5[iVar4] = pvVar3;
        lVar7 = lVar7 + 1;
        pVVar6 = p->vNodeLeaves;
      } while (lVar7 < pVVar6->nSize);
    }
    do {
      iVar4 = Abc_NodeBuildCutLevelOne_int
                        (p->vVisited,p->vConeLeaves,p->nConeSizeMax,p->nConeFanStop);
    } while (iVar4 != 0);
    if (p->nConeSizeMax < p->vConeLeaves->nSize) {
      __assert_fail("Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcReconv.c"
                    ,299,"Vec_Ptr_t *Abc_NodeFindCut(Abc_ManCut_t *, Abc_Obj_t *, int)");
    }
    pVVar6 = p->vVisited;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        puVar1 = (uint *)((long)pVVar6->pArray[lVar7] + 0x14);
        *puVar1 = *puVar1 & 0xffffffdf;
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar6->nSize);
    }
  }
  return p->vNodeLeaves;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCut( Abc_ManCut_t * p, Abc_Obj_t * pRoot, int fContain )
{
    Abc_Obj_t * pNode;
    int i;

    assert( !Abc_ObjIsComplement(pRoot) );
    assert( Abc_ObjIsNode(pRoot) );

    // start the visited nodes and mark them
    Vec_PtrClear( p->vVisited );
    Vec_PtrPush( p->vVisited, pRoot );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vVisited, Abc_ObjFanin1(pRoot) );
    pRoot->fMarkB = 1;
    Abc_ObjFanin0(pRoot)->fMarkB = 1;
    Abc_ObjFanin1(pRoot)->fMarkB = 1;

    // start the cut 
    Vec_PtrClear( p->vNodeLeaves );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin0(pRoot) );
    Vec_PtrPush( p->vNodeLeaves, Abc_ObjFanin1(pRoot) );

    // compute the cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vNodeLeaves, p->nNodeSizeMax, p->nNodeFanStop ) );
    assert( Vec_PtrSize(p->vNodeLeaves) <= p->nNodeSizeMax );

    // return if containing cut is not requested
    if ( !fContain )
    {
        // unmark both fMarkA and fMarkB in tbe TFI
        Abc_NodesUnmarkB( p->vVisited );
        return p->vNodeLeaves;
    }

//printf( "\n\n\n" );
    // compute the containing cut
    assert( p->nNodeSizeMax < p->nConeSizeMax );
    // copy the current boundary
    Vec_PtrClear( p->vConeLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodeLeaves, pNode, i )
        Vec_PtrPush( p->vConeLeaves, pNode );
    // compute the containing cut
    while ( Abc_NodeBuildCutLevelOne_int( p->vVisited, p->vConeLeaves, p->nConeSizeMax, p->nConeFanStop ) );
    assert( Vec_PtrSize(p->vConeLeaves) <= p->nConeSizeMax );
    // unmark TFI using fMarkA and fMarkB
    Abc_NodesUnmarkB( p->vVisited );
    return p->vNodeLeaves;
}